

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptorProto::InitAsDefaultInstance(FileDescriptorProto *this)

{
  if (FileOptions::default_instance_ == (FileOptions *)0x0) {
    protobuf_AddDesc_google_2fprotobuf_2fdescriptor_2eproto();
  }
  this->options_ = FileOptions::default_instance_;
  if (SourceCodeInfo::default_instance_ == (SourceCodeInfo *)0x0) {
    protobuf_AddDesc_google_2fprotobuf_2fdescriptor_2eproto();
  }
  this->source_code_info_ = SourceCodeInfo::default_instance_;
  return;
}

Assistant:

void FileDescriptorProto::InitAsDefaultInstance() {
  options_ = const_cast< ::google::protobuf::FileOptions*>(&::google::protobuf::FileOptions::default_instance());
  source_code_info_ = const_cast< ::google::protobuf::SourceCodeInfo*>(&::google::protobuf::SourceCodeInfo::default_instance());
}